

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_types.cc
# Opt level: O0

int32_t draco::DataTypeLength(DataType dt)

{
  DataType dt_local;
  int32_t local_4;
  
  switch(dt) {
  case DT_INT8:
  case DT_UINT8:
    local_4 = 1;
    break;
  case DT_INT16:
  case DT_UINT16:
    local_4 = 2;
    break;
  case DT_INT32:
  case DT_UINT32:
    local_4 = 4;
    break;
  case DT_INT64:
  case DT_UINT64:
    local_4 = 8;
    break;
  case DT_FLOAT32:
    local_4 = 4;
    break;
  case DT_FLOAT64:
    local_4 = 8;
    break;
  case DT_BOOL:
    local_4 = 1;
    break;
  default:
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int32_t DataTypeLength(DataType dt) {
  switch (dt) {
    case DT_INT8:
    case DT_UINT8:
      return 1;
    case DT_INT16:
    case DT_UINT16:
      return 2;
    case DT_INT32:
    case DT_UINT32:
      return 4;
    case DT_INT64:
    case DT_UINT64:
      return 8;
    case DT_FLOAT32:
      return 4;
    case DT_FLOAT64:
      return 8;
    case DT_BOOL:
      return 1;
    default:
      return -1;
  }
}